

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

EVP_PKEY * d2i_AutoPrivateKey(EVP_PKEY **a,uchar **pp,long length)

{
  uint8_t *puVar1;
  size_t sVar2;
  EVP_PKEY *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  EVP_PKEY **out_local;
  
  cbs.len = length;
  if (length < 0) {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                  ,0xfa);
    out_local = (EVP_PKEY **)0x0;
  }
  else {
    CBS_init((CBS *)&ret,*pp,length);
    out_local = (EVP_PKEY **)EVP_parse_private_key((CBS *)&ret);
    if ((EVP_PKEY *)out_local == (EVP_PKEY *)0x0) {
      ERR_clear_error();
      sVar2 = num_elements(*pp,cbs.len);
      if (sVar2 == 4) {
        out_local = (EVP_PKEY **)d2i_PrivateKey(0x198,a,pp,cbs.len);
      }
      else if (sVar2 == 6) {
        out_local = (EVP_PKEY **)d2i_PrivateKey(0x74,a,pp,cbs.len);
      }
      else {
        out_local = (EVP_PKEY **)d2i_PrivateKey(6,a,pp,cbs.len);
      }
    }
    else {
      if (a != (EVP_PKEY **)0x0) {
        EVP_PKEY_free(*a);
        *a = (EVP_PKEY *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *pp = puVar1;
    }
  }
  return (EVP_PKEY *)out_local;
}

Assistant:

EVP_PKEY *d2i_AutoPrivateKey(EVP_PKEY **out, const uint8_t **inp, long len) {
  if (len < 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return NULL;
  }

  // Parse the input as a PKCS#8 PrivateKeyInfo.
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  EVP_PKEY *ret = EVP_parse_private_key(&cbs);
  if (ret != NULL) {
    if (out != NULL) {
      EVP_PKEY_free(*out);
      *out = ret;
    }
    *inp = CBS_data(&cbs);
    return ret;
  }
  ERR_clear_error();

  // Count the elements to determine the legacy key format.
  switch (num_elements(*inp, (size_t)len)) {
    case 4:
      return d2i_PrivateKey(EVP_PKEY_EC, out, inp, len);

    case 6:
      return d2i_PrivateKey(EVP_PKEY_DSA, out, inp, len);

    default:
      return d2i_PrivateKey(EVP_PKEY_RSA, out, inp, len);
  }
}